

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

optional<wasm::HeapType> __thiscall
wasm::TypeMapper::getDeclaredSuperType(TypeMapper *this,HeapType oldType)

{
  unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
  *this_00;
  bool bVar1;
  HeapType *__x;
  pointer pvVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  optional<wasm::HeapType> oVar4;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_48;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> local_40;
  const_iterator it;
  optional<wasm::HeapType> super;
  TypeMapper *this_local;
  HeapType oldType_local;
  bool local_10;
  
  this_local = (TypeMapper *)oldType.id;
  oVar4 = HeapType::getDeclaredSuperType((HeapType *)&this_local);
  it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur =
       oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&it);
  uVar3 = extraout_RDX;
  if (bVar1) {
    this_00 = this->mapping;
    __x = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&it);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::find(this_00,__x);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>_>
         ::end(this->mapping);
    bVar1 = std::__detail::operator!=(&local_40,&local_48);
    uVar3 = extraout_RDX_00;
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>
                           *)&local_40);
      std::optional<wasm::HeapType>::optional<const_wasm::HeapType_&,_true>
                ((optional<wasm::HeapType> *)&oldType_local,&pvVar2->second);
      uVar3 = extraout_RDX_01;
      goto LAB_01a753e0;
    }
  }
  oldType_local.id =
       (uintptr_t)
       it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>._M_cur;
  local_10 = oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
LAB_01a753e0:
  oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = local_10;
  oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
       (HeapType)(HeapType)oldType_local.id;
  return (optional<wasm::HeapType>)
         oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> getDeclaredSuperType(HeapType oldType) override {
    // If the super is mapped, get it from the mapping.
    auto super = oldType.getDeclaredSuperType();
    if (super) {
      if (auto it = mapping.find(*super); it != mapping.end()) {
        return it->second;
      }
    }
    return super;
  }